

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_decompress.c
# Opt level: O1

int get_file_format(char *filename)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  
  pcVar2 = strrchr(filename,0x2e);
  if ((pcVar2 != (char *)0x0) && (pcVar2[1] != '\0')) {
    lVar3 = 0;
    do {
      iVar1 = strcasecmp(pcVar2 + 1,
                         (char *)((long)&get_file_format_extension_rel +
                                 (long)*(int *)((long)&get_file_format_extension_rel + lVar3)));
      if (iVar1 == 0) {
        return *(int *)((long)get_file_format::format + lVar3);
      }
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x3c);
  }
  return -1;
}

Assistant:

int get_file_format(const char *filename)
{
    unsigned int i;
    static const char *extension[] = {"pgx", "pnm", "pgm", "ppm", "bmp", "tif", "raw", "rawl", "tga", "png", "j2k", "jp2", "jpt", "j2c", "jpc" };
    static const int format[] = { PGX_DFMT, PXM_DFMT, PXM_DFMT, PXM_DFMT, BMP_DFMT, TIF_DFMT, RAW_DFMT, RAWL_DFMT, TGA_DFMT, PNG_DFMT, J2K_CFMT, JP2_CFMT, JPT_CFMT, J2K_CFMT, J2K_CFMT };
    const char * ext = strrchr(filename, '.');
    if (ext == NULL) {
        return -1;
    }
    ext++;
    if (*ext) {
        for (i = 0; i < sizeof(format) / sizeof(*format); i++) {
            if (strcasecmp(ext, extension[i]) == 0) {
                return format[i];
            }
        }
    }

    return -1;
}